

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gosthash2012.c
# Opt level: O0

void g(uint512_u *h,uint512_u *N,uint512_u *m)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  long lVar56;
  ulong *in_RDX;
  ulong *in_RSI;
  ulong *in_RDI;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  ulong uVar63;
  ulong uVar64;
  unsigned_long_long r1_17;
  unsigned_long_long r0_17;
  unsigned_short ax_17;
  __m128i tmm4_17;
  unsigned_long_long r1_16;
  unsigned_long_long r0_16;
  unsigned_short ax_16;
  __m128i tmm4_16;
  __m128i *__m128p_4;
  __m128i tmm3_4;
  __m128i tmm2_4;
  __m128i tmm1_4;
  __m128i tmm0_4;
  unsigned_long_long r1_15;
  unsigned_long_long r0_15;
  unsigned_short ax_15;
  __m128i tmm4_15;
  unsigned_long_long r1_14;
  unsigned_long_long r0_14;
  unsigned_short ax_14;
  __m128i tmm4_14;
  unsigned_long_long r1_13;
  unsigned_long_long r0_13;
  unsigned_short ax_13;
  __m128i tmm4_13;
  unsigned_long_long r1_12;
  unsigned_long_long r0_12;
  unsigned_short ax_12;
  __m128i tmm4_12;
  __m128i tmm3_3;
  __m128i tmm2_3;
  __m128i tmm1_3;
  __m128i tmm0_3;
  unsigned_long_long r1_11;
  unsigned_long_long r0_11;
  unsigned_short ax_11;
  __m128i tmm4_11;
  unsigned_long_long r1_10;
  unsigned_long_long r0_10;
  unsigned_short ax_10;
  __m128i tmm4_10;
  unsigned_long_long r1_9;
  unsigned_long_long r0_9;
  unsigned_short ax_9;
  __m128i tmm4_9;
  unsigned_long_long r1_8;
  unsigned_long_long r0_8;
  unsigned_short ax_8;
  __m128i tmm4_8;
  __m128i *__m128p_3;
  __m128i tmm3_2;
  __m128i tmm2_2;
  __m128i tmm1_2;
  __m128i tmm0_2;
  unsigned_long_long r1_7;
  unsigned_long_long r0_7;
  unsigned_short ax_7;
  __m128i tmm4_7;
  unsigned_long_long r1_6;
  unsigned_long_long r0_6;
  unsigned_short ax_6;
  __m128i tmm4_6;
  unsigned_long_long r1_5;
  unsigned_long_long r0_5;
  unsigned_short ax_5;
  __m128i tmm4_5;
  unsigned_long_long r1_4;
  unsigned_long_long r0_4;
  unsigned_short ax_4;
  __m128i tmm4_4;
  __m128i tmm3_1;
  __m128i tmm2_1;
  __m128i tmm1_1;
  __m128i tmm0_1;
  __m128i *__m128p_2;
  unsigned_long_long r1_3;
  unsigned_long_long r0_3;
  unsigned_short ax_3;
  __m128i tmm4_3;
  unsigned_long_long r1_2;
  unsigned_long_long r0_2;
  unsigned_short ax_2;
  __m128i tmm4_2;
  unsigned_long_long r1_1;
  unsigned_long_long r0_1;
  unsigned_short ax_1;
  __m128i tmm4_1;
  unsigned_long_long r1;
  unsigned_long_long r0;
  unsigned_short ax;
  __m128i tmm4;
  __m128i *__m128p_1;
  __m128i tmm3;
  __m128i tmm2;
  __m128i tmm1;
  __m128i tmm0;
  __m128i *__m128p;
  uint i;
  __m128i xmm7;
  __m128i xmm5;
  __m128i xmm3;
  __m128i xmm1;
  __m128i xmm6;
  __m128i xmm4;
  __m128i xmm2;
  __m128i xmm0;
  uint local_d7c;
  ulong local_d78;
  ulong uStack_d70;
  ulong local_d68;
  ulong uStack_d60;
  ulong local_d58;
  ulong uStack_d50;
  ulong local_d48;
  ulong uStack_d40;
  ulong local_d38;
  ulong uStack_d30;
  ulong local_d28;
  ulong uStack_d20;
  ulong local_d18;
  ulong uStack_d10;
  ulong local_d08;
  ulong uStack_d00;
  __m128i *__m128p_7;
  __m128i *__m128p_6;
  __m128i *__m128p_5;
  unsigned_long_long r1_19;
  unsigned_long_long r0_19;
  unsigned_short ax_19;
  __m128i tmm4_19;
  unsigned_long_long r1_18;
  unsigned_long_long r0_18;
  unsigned_short ax_18;
  __m128i tmm4_18;
  
  uVar57 = *in_RSI ^ *in_RDI;
  uVar61 = in_RSI[1] ^ in_RDI[1];
  uVar58 = in_RSI[2] ^ in_RDI[2];
  uVar62 = in_RSI[3] ^ in_RDI[3];
  uVar59 = in_RSI[4] ^ in_RDI[4];
  uVar63 = in_RSI[5] ^ in_RDI[5];
  uVar60 = in_RSI[6] ^ in_RDI[6];
  uVar64 = in_RSI[7] ^ in_RDI[7];
  local_d08 = Ax[0][uVar57 & 0xff] ^ Ax[1][uVar61 & 0xff] ^ Ax[2][uVar58 & 0xff] ^
              Ax[3][uVar62 & 0xff] ^ Ax[4][uVar59 & 0xff] ^ Ax[5][uVar63 & 0xff] ^
              Ax[6][uVar60 & 0xff] ^ Ax[7][uVar64 & 0xff];
  uStack_d00 = Ax[0][uVar57 >> 8 & 0xff] ^ Ax[1][uVar61 >> 8 & 0xff] ^ Ax[2][uVar58 >> 8 & 0xff] ^
               Ax[3][uVar62 >> 8 & 0xff] ^ Ax[4][uVar59 >> 8 & 0xff] ^ Ax[5][uVar63 >> 8 & 0xff] ^
               Ax[6][uVar60 >> 8 & 0xff] ^ Ax[7][uVar64 >> 8 & 0xff];
  local_d18 = Ax[0][uVar57 >> 0x10 & 0xff] ^ Ax[1][uVar61 >> 0x10 & 0xff] ^
              Ax[2][uVar58 >> 0x10 & 0xff] ^ Ax[3][uVar62 >> 0x10 & 0xff] ^
              Ax[4][uVar59 >> 0x10 & 0xff] ^ Ax[5][uVar63 >> 0x10 & 0xff] ^
              Ax[6][uVar60 >> 0x10 & 0xff] ^ Ax[7][uVar64 >> 0x10 & 0xff];
  uStack_d10 = Ax[0][uVar57 >> 0x18 & 0xff] ^ Ax[1][uVar61 >> 0x18 & 0xff] ^
               Ax[2][uVar58 >> 0x18 & 0xff] ^ Ax[3][uVar62 >> 0x18 & 0xff] ^
               Ax[4][uVar59 >> 0x18 & 0xff] ^ Ax[5][uVar63 >> 0x18 & 0xff] ^
               Ax[6][uVar60 >> 0x18 & 0xff] ^ Ax[7][uVar64 >> 0x18 & 0xff];
  local_d28 = Ax[0][uVar57 >> 0x20 & 0xff] ^ Ax[1][uVar61 >> 0x20 & 0xff] ^
              Ax[2][uVar58 >> 0x20 & 0xff] ^ Ax[3][uVar62 >> 0x20 & 0xff] ^
              Ax[4][uVar59 >> 0x20 & 0xff] ^ Ax[5][uVar63 >> 0x20 & 0xff] ^
              Ax[6][uVar60 >> 0x20 & 0xff] ^ Ax[7][uVar64 >> 0x20 & 0xff];
  uStack_d20 = Ax[0][uVar57 >> 0x28 & 0xff] ^ Ax[1][uVar61 >> 0x28 & 0xff] ^
               Ax[2][uVar58 >> 0x28 & 0xff] ^ Ax[3][uVar62 >> 0x28 & 0xff] ^
               Ax[4][uVar59 >> 0x28 & 0xff] ^ Ax[5][uVar63 >> 0x28 & 0xff] ^
               Ax[6][uVar60 >> 0x28 & 0xff] ^ Ax[7][uVar64 >> 0x28 & 0xff];
  local_d38 = Ax[0][uVar57 >> 0x30 & 0xff] ^ Ax[1][uVar61 >> 0x30 & 0xff] ^
              Ax[2][uVar58 >> 0x30 & 0xff] ^ Ax[3][uVar62 >> 0x30 & 0xff] ^
              Ax[4][uVar59 >> 0x30 & 0xff] ^ Ax[5][uVar63 >> 0x30 & 0xff] ^
              Ax[6][uVar60 >> 0x30 & 0xff] ^ Ax[7][uVar64 >> 0x30 & 0xff];
  uStack_d30 = Ax[0][uVar57 >> 0x38] ^ Ax[1][uVar61 >> 0x38] ^ Ax[2][uVar58 >> 0x38] ^
               Ax[3][uVar62 >> 0x38] ^ Ax[4][uVar59 >> 0x38] ^ Ax[5][uVar63 >> 0x38] ^
               Ax[6][uVar60 >> 0x38] ^ Ax[7][uVar64 >> 0x38];
  uVar57 = *in_RDX ^ local_d08;
  uVar61 = in_RDX[1] ^ uStack_d00;
  uVar58 = in_RDX[2] ^ local_d18;
  uVar62 = in_RDX[3] ^ uStack_d10;
  uVar59 = in_RDX[4] ^ local_d28;
  uVar63 = in_RDX[5] ^ uStack_d20;
  uVar60 = in_RDX[6] ^ local_d38;
  uVar64 = in_RDX[7] ^ uStack_d30;
  local_d48 = Ax[0][uVar57 & 0xff] ^ Ax[1][uVar61 & 0xff] ^ Ax[2][uVar58 & 0xff] ^
              Ax[3][uVar62 & 0xff] ^ Ax[4][uVar59 & 0xff] ^ Ax[5][uVar63 & 0xff] ^
              Ax[6][uVar60 & 0xff] ^ Ax[7][uVar64 & 0xff];
  uStack_d40 = Ax[0][uVar57 >> 8 & 0xff] ^ Ax[1][uVar61 >> 8 & 0xff] ^ Ax[2][uVar58 >> 8 & 0xff] ^
               Ax[3][uVar62 >> 8 & 0xff] ^ Ax[4][uVar59 >> 8 & 0xff] ^ Ax[5][uVar63 >> 8 & 0xff] ^
               Ax[6][uVar60 >> 8 & 0xff] ^ Ax[7][uVar64 >> 8 & 0xff];
  local_d58 = Ax[0][uVar57 >> 0x10 & 0xff] ^ Ax[1][uVar61 >> 0x10 & 0xff] ^
              Ax[2][uVar58 >> 0x10 & 0xff] ^ Ax[3][uVar62 >> 0x10 & 0xff] ^
              Ax[4][uVar59 >> 0x10 & 0xff] ^ Ax[5][uVar63 >> 0x10 & 0xff] ^
              Ax[6][uVar60 >> 0x10 & 0xff] ^ Ax[7][uVar64 >> 0x10 & 0xff];
  uStack_d50 = Ax[0][uVar57 >> 0x18 & 0xff] ^ Ax[1][uVar61 >> 0x18 & 0xff] ^
               Ax[2][uVar58 >> 0x18 & 0xff] ^ Ax[3][uVar62 >> 0x18 & 0xff] ^
               Ax[4][uVar59 >> 0x18 & 0xff] ^ Ax[5][uVar63 >> 0x18 & 0xff] ^
               Ax[6][uVar60 >> 0x18 & 0xff] ^ Ax[7][uVar64 >> 0x18 & 0xff];
  local_d68 = Ax[0][uVar57 >> 0x20 & 0xff] ^ Ax[1][uVar61 >> 0x20 & 0xff] ^
              Ax[2][uVar58 >> 0x20 & 0xff] ^ Ax[3][uVar62 >> 0x20 & 0xff] ^
              Ax[4][uVar59 >> 0x20 & 0xff] ^ Ax[5][uVar63 >> 0x20 & 0xff] ^
              Ax[6][uVar60 >> 0x20 & 0xff] ^ Ax[7][uVar64 >> 0x20 & 0xff];
  uStack_d60 = Ax[0][uVar57 >> 0x28 & 0xff] ^ Ax[1][uVar61 >> 0x28 & 0xff] ^
               Ax[2][uVar58 >> 0x28 & 0xff] ^ Ax[3][uVar62 >> 0x28 & 0xff] ^
               Ax[4][uVar59 >> 0x28 & 0xff] ^ Ax[5][uVar63 >> 0x28 & 0xff] ^
               Ax[6][uVar60 >> 0x28 & 0xff] ^ Ax[7][uVar64 >> 0x28 & 0xff];
  local_d78 = Ax[0][uVar57 >> 0x30 & 0xff] ^ Ax[1][uVar61 >> 0x30 & 0xff] ^
              Ax[2][uVar58 >> 0x30 & 0xff] ^ Ax[3][uVar62 >> 0x30 & 0xff] ^
              Ax[4][uVar59 >> 0x30 & 0xff] ^ Ax[5][uVar63 >> 0x30 & 0xff] ^
              Ax[6][uVar60 >> 0x30 & 0xff] ^ Ax[7][uVar64 >> 0x30 & 0xff];
  uStack_d70 = Ax[0][uVar57 >> 0x38] ^ Ax[1][uVar61 >> 0x38] ^ Ax[2][uVar58 >> 0x38] ^
               Ax[3][uVar62 >> 0x38] ^ Ax[4][uVar59 >> 0x38] ^ Ax[5][uVar63 >> 0x38] ^
               Ax[6][uVar60 >> 0x38] ^ Ax[7][uVar64 >> 0x38];
  for (local_d7c = 0; local_d7c < 0xb; local_d7c = local_d7c + 1) {
    lVar56 = (ulong)local_d7c * 0x40;
    uVar57 = local_d08 ^ C[local_d7c].QWORD[0];
    uVar61 = uStack_d00 ^ *(ulong *)((long)C + lVar56 + 8);
    uVar58 = local_d18 ^ *(ulong *)((long)C + lVar56 + 0x10);
    uVar62 = uStack_d10 ^ *(ulong *)((long)C + lVar56 + 0x18);
    uVar59 = local_d28 ^ *(ulong *)((long)C + lVar56 + 0x20);
    uVar63 = uStack_d20 ^ *(ulong *)((long)C + lVar56 + 0x28);
    uVar60 = local_d38 ^ *(ulong *)((long)C + lVar56 + 0x30);
    uStack_d30 = uStack_d30 ^ *(ulong *)((long)C + lVar56 + 0x38);
    local_d08 = Ax[0][uVar57 & 0xff] ^ Ax[1][uVar61 & 0xff] ^ Ax[2][uVar58 & 0xff] ^
                Ax[3][uVar62 & 0xff] ^ Ax[4][uVar59 & 0xff] ^ Ax[5][uVar63 & 0xff] ^
                Ax[6][uVar60 & 0xff] ^ Ax[7][uStack_d30 & 0xff];
    uStack_d00 = Ax[0][uVar57 >> 8 & 0xff] ^ Ax[1][uVar61 >> 8 & 0xff] ^ Ax[2][uVar58 >> 8 & 0xff] ^
                 Ax[3][uVar62 >> 8 & 0xff] ^ Ax[4][uVar59 >> 8 & 0xff] ^ Ax[5][uVar63 >> 8 & 0xff] ^
                 Ax[6][uVar60 >> 8 & 0xff] ^ Ax[7][uStack_d30 >> 8 & 0xff];
    local_d18 = Ax[0][uVar57 >> 0x10 & 0xff] ^ Ax[1][uVar61 >> 0x10 & 0xff] ^
                Ax[2][uVar58 >> 0x10 & 0xff] ^ Ax[3][uVar62 >> 0x10 & 0xff] ^
                Ax[4][uVar59 >> 0x10 & 0xff] ^ Ax[5][uVar63 >> 0x10 & 0xff] ^
                Ax[6][uVar60 >> 0x10 & 0xff] ^ Ax[7][uStack_d30 >> 0x10 & 0xff];
    uStack_d10 = Ax[0][uVar57 >> 0x18 & 0xff] ^ Ax[1][uVar61 >> 0x18 & 0xff] ^
                 Ax[2][uVar58 >> 0x18 & 0xff] ^ Ax[3][uVar62 >> 0x18 & 0xff] ^
                 Ax[4][uVar59 >> 0x18 & 0xff] ^ Ax[5][uVar63 >> 0x18 & 0xff] ^
                 Ax[6][uVar60 >> 0x18 & 0xff] ^ Ax[7][uStack_d30 >> 0x18 & 0xff];
    local_d28 = Ax[0][uVar57 >> 0x20 & 0xff] ^ Ax[1][uVar61 >> 0x20 & 0xff] ^
                Ax[2][uVar58 >> 0x20 & 0xff] ^ Ax[3][uVar62 >> 0x20 & 0xff] ^
                Ax[4][uVar59 >> 0x20 & 0xff] ^ Ax[5][uVar63 >> 0x20 & 0xff] ^
                Ax[6][uVar60 >> 0x20 & 0xff] ^ Ax[7][uStack_d30 >> 0x20 & 0xff];
    uStack_d20 = Ax[0][uVar57 >> 0x28 & 0xff] ^ Ax[1][uVar61 >> 0x28 & 0xff] ^
                 Ax[2][uVar58 >> 0x28 & 0xff] ^ Ax[3][uVar62 >> 0x28 & 0xff] ^
                 Ax[4][uVar59 >> 0x28 & 0xff] ^ Ax[5][uVar63 >> 0x28 & 0xff] ^
                 Ax[6][uVar60 >> 0x28 & 0xff] ^ Ax[7][uStack_d30 >> 0x28 & 0xff];
    local_d38 = Ax[0][uVar57 >> 0x30 & 0xff] ^ Ax[1][uVar61 >> 0x30 & 0xff] ^
                Ax[2][uVar58 >> 0x30 & 0xff] ^ Ax[3][uVar62 >> 0x30 & 0xff] ^
                Ax[4][uVar59 >> 0x30 & 0xff] ^ Ax[5][uVar63 >> 0x30 & 0xff] ^
                Ax[6][uVar60 >> 0x30 & 0xff] ^ Ax[7][uStack_d30 >> 0x30 & 0xff];
    uStack_d30 = Ax[0][uVar57 >> 0x38] ^ Ax[1][uVar61 >> 0x38] ^ Ax[2][uVar58 >> 0x38] ^
                 Ax[3][uVar62 >> 0x38] ^ Ax[4][uVar59 >> 0x38] ^ Ax[5][uVar63 >> 0x38] ^
                 Ax[6][uVar60 >> 0x38] ^ Ax[7][uStack_d30 >> 0x38];
    uVar57 = local_d48 ^ local_d08;
    uVar61 = uStack_d40 ^ uStack_d00;
    uVar58 = local_d58 ^ local_d18;
    uVar62 = uStack_d50 ^ uStack_d10;
    uVar59 = local_d68 ^ local_d28;
    uVar63 = uStack_d60 ^ uStack_d20;
    uVar60 = local_d78 ^ local_d38;
    uStack_d70 = uStack_d70 ^ uStack_d30;
    local_d48 = Ax[0][uVar57 & 0xff] ^ Ax[1][uVar61 & 0xff] ^ Ax[2][uVar58 & 0xff] ^
                Ax[3][uVar62 & 0xff] ^ Ax[4][uVar59 & 0xff] ^ Ax[5][uVar63 & 0xff] ^
                Ax[6][uVar60 & 0xff] ^ Ax[7][uStack_d70 & 0xff];
    uStack_d40 = Ax[0][uVar57 >> 8 & 0xff] ^ Ax[1][uVar61 >> 8 & 0xff] ^ Ax[2][uVar58 >> 8 & 0xff] ^
                 Ax[3][uVar62 >> 8 & 0xff] ^ Ax[4][uVar59 >> 8 & 0xff] ^ Ax[5][uVar63 >> 8 & 0xff] ^
                 Ax[6][uVar60 >> 8 & 0xff] ^ Ax[7][uStack_d70 >> 8 & 0xff];
    local_d58 = Ax[0][uVar57 >> 0x10 & 0xff] ^ Ax[1][uVar61 >> 0x10 & 0xff] ^
                Ax[2][uVar58 >> 0x10 & 0xff] ^ Ax[3][uVar62 >> 0x10 & 0xff] ^
                Ax[4][uVar59 >> 0x10 & 0xff] ^ Ax[5][uVar63 >> 0x10 & 0xff] ^
                Ax[6][uVar60 >> 0x10 & 0xff] ^ Ax[7][uStack_d70 >> 0x10 & 0xff];
    uStack_d50 = Ax[0][uVar57 >> 0x18 & 0xff] ^ Ax[1][uVar61 >> 0x18 & 0xff] ^
                 Ax[2][uVar58 >> 0x18 & 0xff] ^ Ax[3][uVar62 >> 0x18 & 0xff] ^
                 Ax[4][uVar59 >> 0x18 & 0xff] ^ Ax[5][uVar63 >> 0x18 & 0xff] ^
                 Ax[6][uVar60 >> 0x18 & 0xff] ^ Ax[7][uStack_d70 >> 0x18 & 0xff];
    local_d68 = Ax[0][uVar57 >> 0x20 & 0xff] ^ Ax[1][uVar61 >> 0x20 & 0xff] ^
                Ax[2][uVar58 >> 0x20 & 0xff] ^ Ax[3][uVar62 >> 0x20 & 0xff] ^
                Ax[4][uVar59 >> 0x20 & 0xff] ^ Ax[5][uVar63 >> 0x20 & 0xff] ^
                Ax[6][uVar60 >> 0x20 & 0xff] ^ Ax[7][uStack_d70 >> 0x20 & 0xff];
    uStack_d60 = Ax[0][uVar57 >> 0x28 & 0xff] ^ Ax[1][uVar61 >> 0x28 & 0xff] ^
                 Ax[2][uVar58 >> 0x28 & 0xff] ^ Ax[3][uVar62 >> 0x28 & 0xff] ^
                 Ax[4][uVar59 >> 0x28 & 0xff] ^ Ax[5][uVar63 >> 0x28 & 0xff] ^
                 Ax[6][uVar60 >> 0x28 & 0xff] ^ Ax[7][uStack_d70 >> 0x28 & 0xff];
    local_d78 = Ax[0][uVar57 >> 0x30 & 0xff] ^ Ax[1][uVar61 >> 0x30 & 0xff] ^
                Ax[2][uVar58 >> 0x30 & 0xff] ^ Ax[3][uVar62 >> 0x30 & 0xff] ^
                Ax[4][uVar59 >> 0x30 & 0xff] ^ Ax[5][uVar63 >> 0x30 & 0xff] ^
                Ax[6][uVar60 >> 0x30 & 0xff] ^ Ax[7][uStack_d70 >> 0x30 & 0xff];
    uStack_d70 = Ax[0][uVar57 >> 0x38] ^ Ax[1][uVar61 >> 0x38] ^ Ax[2][uVar58 >> 0x38] ^
                 Ax[3][uVar62 >> 0x38] ^ Ax[4][uVar59 >> 0x38] ^ Ax[5][uVar63 >> 0x38] ^
                 Ax[6][uVar60 >> 0x38] ^ Ax[7][uStack_d70 >> 0x38];
  }
  local_d08 = local_d08 ^ 0x48bc924af11bd720;
  uStack_d00 = uStack_d00 ^ 0xfaf417d5d9b21b99;
  local_d18 = local_d18 ^ 0xe71da4aa88e12852;
  uStack_d10 = uStack_d10 ^ 0x5d80ef9d1891cc86;
  local_d28 = local_d28 ^ 0xf82012d430219f9b;
  uStack_d20 = uStack_d20 ^ 0xcda43c32bcdf1d77;
  local_d38 = local_d38 ^ 0xd21380b00449b17a;
  uStack_d30 = uStack_d30 ^ 0x378ee767f11631ba;
  uVar57 = Ax[0][local_d08 >> 8 & 0xff];
  uVar58 = Ax[1][uStack_d00 >> 8 & 0xff];
  uVar59 = Ax[2][local_d18 >> 8 & 0xff];
  uVar60 = Ax[3][uStack_d10 >> 8 & 0xff];
  uVar61 = Ax[4][local_d28 >> 8 & 0xff];
  uVar62 = Ax[5][uStack_d20 >> 8 & 0xff];
  uVar63 = Ax[6][local_d38 >> 8 & 0xff];
  uVar64 = Ax[7][uStack_d30 >> 8 & 0xff];
  uVar1 = Ax[0][local_d08 >> 0x10 & 0xff];
  uVar2 = Ax[0][local_d08 >> 0x18 & 0xff];
  uVar3 = Ax[1][uStack_d00 >> 0x10 & 0xff];
  uVar4 = Ax[1][uStack_d00 >> 0x18 & 0xff];
  uVar5 = Ax[2][local_d18 >> 0x10 & 0xff];
  uVar6 = Ax[2][local_d18 >> 0x18 & 0xff];
  uVar7 = Ax[3][uStack_d10 >> 0x10 & 0xff];
  uVar8 = Ax[3][uStack_d10 >> 0x18 & 0xff];
  uVar9 = Ax[4][local_d28 >> 0x10 & 0xff];
  uVar10 = Ax[4][local_d28 >> 0x18 & 0xff];
  uVar11 = Ax[5][uStack_d20 >> 0x10 & 0xff];
  uVar12 = Ax[5][uStack_d20 >> 0x18 & 0xff];
  uVar13 = Ax[6][local_d38 >> 0x10 & 0xff];
  uVar14 = Ax[6][local_d38 >> 0x18 & 0xff];
  uVar15 = Ax[7][uStack_d30 >> 0x10 & 0xff];
  uVar16 = Ax[7][uStack_d30 >> 0x18 & 0xff];
  uVar17 = Ax[0][local_d08 >> 0x20 & 0xff];
  uVar18 = Ax[0][local_d08 >> 0x28 & 0xff];
  uVar19 = Ax[1][uStack_d00 >> 0x20 & 0xff];
  uVar20 = Ax[1][uStack_d00 >> 0x28 & 0xff];
  uVar21 = Ax[2][local_d18 >> 0x20 & 0xff];
  uVar22 = Ax[2][local_d18 >> 0x28 & 0xff];
  uVar23 = Ax[3][uStack_d10 >> 0x20 & 0xff];
  uVar24 = Ax[3][uStack_d10 >> 0x28 & 0xff];
  uVar25 = Ax[4][local_d28 >> 0x20 & 0xff];
  uVar26 = Ax[4][local_d28 >> 0x28 & 0xff];
  uVar27 = Ax[5][uStack_d20 >> 0x20 & 0xff];
  uVar28 = Ax[5][uStack_d20 >> 0x28 & 0xff];
  uVar29 = Ax[6][local_d38 >> 0x20 & 0xff];
  uVar30 = Ax[6][local_d38 >> 0x28 & 0xff];
  uVar31 = Ax[7][uStack_d30 >> 0x20 & 0xff];
  uVar32 = Ax[7][uStack_d30 >> 0x28 & 0xff];
  uVar33 = Ax[0][local_d08 >> 0x30 & 0xff];
  uVar34 = Ax[0][local_d08 >> 0x38];
  uVar35 = Ax[1][uStack_d00 >> 0x30 & 0xff];
  uVar36 = Ax[1][uStack_d00 >> 0x38];
  uVar37 = Ax[2][local_d18 >> 0x30 & 0xff];
  uVar38 = Ax[2][local_d18 >> 0x38];
  uVar39 = Ax[3][uStack_d10 >> 0x30 & 0xff];
  uVar40 = Ax[3][uStack_d10 >> 0x38];
  uVar41 = Ax[4][local_d28 >> 0x30 & 0xff];
  uVar42 = Ax[4][local_d28 >> 0x38];
  uVar43 = Ax[5][uStack_d20 >> 0x30 & 0xff];
  uVar44 = Ax[5][uStack_d20 >> 0x38];
  uVar45 = Ax[6][local_d38 >> 0x30 & 0xff];
  uVar46 = Ax[6][local_d38 >> 0x38];
  uVar47 = Ax[7][uStack_d30 >> 0x30 & 0xff];
  uVar48 = Ax[7][uStack_d30 >> 0x38];
  uVar49 = in_RDX[1];
  uVar50 = in_RDX[2];
  uVar51 = in_RDX[3];
  uVar52 = in_RDX[4];
  uVar53 = in_RDX[5];
  uVar54 = in_RDX[6];
  uVar55 = in_RDX[7];
  *in_RDI = Ax[0][local_d08 & 0xff] ^ Ax[1][uStack_d00 & 0xff] ^ Ax[2][local_d18 & 0xff] ^
            Ax[3][uStack_d10 & 0xff] ^ Ax[4][local_d28 & 0xff] ^ Ax[5][uStack_d20 & 0xff] ^
            Ax[6][local_d38 & 0xff] ^ Ax[7][uStack_d30 & 0xff] ^ local_d48 ^ *in_RDI ^ *in_RDX;
  in_RDI[1] = uVar57 ^ uVar58 ^ uVar59 ^ uVar60 ^ uVar61 ^ uVar62 ^ uVar63 ^ uVar64 ^ uStack_d40 ^
              in_RDI[1] ^ uVar49;
  in_RDI[2] = uVar1 ^ uVar3 ^ uVar5 ^ uVar7 ^ uVar9 ^ uVar11 ^ uVar13 ^ uVar15 ^ local_d58 ^
              in_RDI[2] ^ uVar50;
  in_RDI[3] = uVar2 ^ uVar4 ^ uVar6 ^ uVar8 ^ uVar10 ^ uVar12 ^ uVar14 ^ uVar16 ^ uStack_d50 ^
              in_RDI[3] ^ uVar51;
  in_RDI[4] = uVar17 ^ uVar19 ^ uVar21 ^ uVar23 ^ uVar25 ^ uVar27 ^ uVar29 ^ uVar31 ^ local_d68 ^
              in_RDI[4] ^ uVar52;
  in_RDI[5] = uVar18 ^ uVar20 ^ uVar22 ^ uVar24 ^ uVar26 ^ uVar28 ^ uVar30 ^ uVar32 ^ uStack_d60 ^
              in_RDI[5] ^ uVar53;
  in_RDI[6] = uVar33 ^ uVar35 ^ uVar37 ^ uVar39 ^ uVar41 ^ uVar43 ^ uVar45 ^ uVar47 ^ local_d78 ^
              in_RDI[6] ^ uVar54;
  in_RDI[7] = uVar34 ^ uVar36 ^ uVar38 ^ uVar40 ^ uVar42 ^ uVar44 ^ uVar46 ^ uVar48 ^ uStack_d70 ^
              in_RDI[7] ^ uVar55;
  return;
}

Assistant:

static void g(union uint512_u *h, const union uint512_u * RESTRICT N,
              const union uint512_u * RESTRICT m)
{
#ifdef __GOST3411_HAS_SSE2__
    __m128i xmm0, xmm2, xmm4, xmm6; /* XMMR0-quadruple */
    __m128i xmm1, xmm3, xmm5, xmm7; /* XMMR1-quadruple */
    unsigned int i;

    LOAD(N, xmm0, xmm2, xmm4, xmm6);
    XLPS128M(h, xmm0, xmm2, xmm4, xmm6);

    ULOAD(m, xmm1, xmm3, xmm5, xmm7);
    XLPS128R(xmm0, xmm2, xmm4, xmm6, xmm1, xmm3, xmm5, xmm7);

    for (i = 0; i < 11; i++)
        ROUND128(i, xmm0, xmm2, xmm4, xmm6, xmm1, xmm3, xmm5, xmm7);

    XLPS128M((&C[11]), xmm0, xmm2, xmm4, xmm6);
    X128R(xmm0, xmm2, xmm4, xmm6, xmm1, xmm3, xmm5, xmm7);

    X128M(h, xmm0, xmm2, xmm4, xmm6);
    ULOAD(m, xmm1, xmm3, xmm5, xmm7);
    X128R(xmm0, xmm2, xmm4, xmm6, xmm1, xmm3, xmm5, xmm7);

    STORE(h, xmm0, xmm2, xmm4, xmm6);
# ifndef __i386__
    /* Restore the Floating-point status on the CPU */
    /* This is only required on MMX, but EXTRACT32 is using MMX */
    _mm_empty();
# endif
#else
    union uint512_u Ki, data;
    unsigned int i;

    XLPS(h, N, (&data));

    /* Starting E() */
    Ki = data;
    XLPS((&Ki), ((const union uint512_u *)&m[0]), (&data));

    for (i = 0; i < 11; i++)
        ROUND(i, (&Ki), (&data));

    XLPS((&Ki), (&C[11]), (&Ki));
    X((&Ki), (&data), (&data));
    /* E() done */

    X((&data), h, (&data));
    X((&data), m, h);
#endif
}